

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O2

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::CloneProperties
          (SerializationCloner<Js::StreamWriter> *this,SrcTypeId srcTypeId,Src src,Dst dst)

{
  ScriptContext *requestContext;
  bool bVar1;
  int iVar2;
  ScriptContext *pSVar3;
  JavascriptArray *arr;
  undefined1 local_a0 [8];
  ObjectPropertyEnumerator propEnumerator;
  JavascriptStaticEnumerator enumerator;
  
  pSVar3 = (ScriptContext *)VarTo<Js::RecyclableObject>(src);
  JavascriptStaticEnumerator::JavascriptStaticEnumerator
            ((JavascriptStaticEnumerator *)&propEnumerator.m_value);
  requestContext =
       (this->
       super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
       ).super_ScriptContextHolder.m_scriptContext;
  bVar1 = DynamicObject::IsAnyArrayTypeId(srcTypeId);
  if (bVar1) {
    arr = JavascriptArray::FromAnyArray(src);
    bVar1 = IsSparseArray(arr);
    Write(this,bVar1 + 0x32);
    Write(this,(arr->super_ArrayObject).length);
    if (bVar1) {
      WriteSparseArrayIndexProperties(this,arr);
    }
    else {
      WriteDenseArrayIndexProperties(this,arr);
    }
    JavascriptArray::GetNonIndexEnumerator
              (arr,(JavascriptStaticEnumerator *)&propEnumerator.m_value,requestContext);
  }
  else {
    iVar2 = (*((IRecyclerVisitedObject *)&(pSVar3->super_ScriptContextInfo)._vptr_ScriptContextInfo)
              ->_vptr_IRecyclerVisitedObject[0x2b])
                      (pSVar3,&propEnumerator.m_value,4,requestContext,0);
    if (iVar2 == 0) {
      local_a0._0_4_ = 0xffffffff;
      StreamWriter::Write<unsigned_int>(this->m_writer,(uint *)local_a0);
      return;
    }
  }
  propEnumerator.m_obj = (RecyclableObject *)&propEnumerator.m_value;
  propEnumerator.m_innerEnumerator = (JavascriptStaticEnumerator *)0x0;
  propEnumerator.m_name = (JavascriptString *)0x0;
  local_a0 = (undefined1  [8])requestContext;
  propEnumerator.super_ScriptContextHolder.m_scriptContext = pSVar3;
  WriteObjectProperties<Js::ObjectPropertyEnumerator>(this,(ObjectPropertyEnumerator *)local_a0);
  return;
}

Assistant:

void SerializationCloner<Writer>::CloneProperties(SrcTypeId srcTypeId, Src src, Dst dst)
    {
        RecyclableObject* obj = VarTo<RecyclableObject>(src);
        // allocate the JavascriptStaticEnumerator on the heap to avoid blowing the stack
        JavascriptStaticEnumerator enumerator;
        ScriptContext* scriptContext = this->GetScriptContext();
        if (DynamicObject::IsAnyArrayTypeId(srcTypeId))
        {
            JavascriptArray* arr = JavascriptArray::FromAnyArray(src);
            bool isSparseArray = IsSparseArray(arr);

            WriteTypeId(isSparseArray ? SCA_SparseArray : SCA_DenseArray);
            Write(arr->GetLength());

            if (isSparseArray)
            {
                WriteSparseArrayIndexProperties(arr);
            }
            else
            {
                WriteDenseArrayIndexProperties(arr);
            }

            // Now we only need to write remaining non-index properties
            arr->GetNonIndexEnumerator(&enumerator, scriptContext);
        }
        else if (!obj->GetEnumerator(&enumerator, EnumeratorFlags::SnapShotSemantics, scriptContext))
        {
            // Mark property end if we don't have enumerator
            m_writer->Write(static_cast<uint32>(SCA_PROPERTY_TERMINATOR));
            return;
        }

        ObjectPropertyEnumerator propEnumerator(scriptContext, obj, &enumerator);
        WriteObjectProperties(&propEnumerator);
    }